

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O0

void __thiscall
Minisat::IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::insert
          (IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_> *this,int key,
          VarData val)

{
  VarData *pVVar1;
  int key_local;
  IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_> *this_local;
  VarData val_local;
  
  reserve(this,key);
  pVVar1 = operator[](this,key);
  *pVVar1 = val;
  return;
}

Assistant:

void     insert (K key, V val)       { reserve(key); operator[](key) = val; }